

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int bam_readrec(BGZF *fp,void *ignored,void *bv,int *tid,int *beg,int *end)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  iVar3 = bam_read1(fp,(bam1_t *)bv);
  if (-1 < iVar3) {
    *tid = *bv;
    iVar1 = *(int *)((long)bv + 4);
    *beg = iVar1;
    uVar4 = *(ulong *)((long)bv + 8) >> 0x30;
    iVar5 = 1;
    if (uVar4 != 0) {
      uVar6 = 0;
      iVar5 = 0;
      do {
        uVar2 = *(uint *)((*(ulong *)((long)bv + 8) >> 0x18 & 0xff) + *(long *)((long)bv + 0x28) +
                         uVar6 * 4);
        iVar5 = iVar5 + (uVar2 >> 4 &
                        (int)((0x3c1a7U >> ((char)uVar2 * '\x02' & 0x1fU)) << 0x1e) >> 0x1f);
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    *end = iVar5 + iVar1;
  }
  return iVar3;
}

Assistant:

static int bam_readrec(BGZF *fp, void *ignored, void *bv, int *tid, int *beg, int *end)
{
    bam1_t *b = bv;
    int ret;
    if ((ret = bam_read1(fp, b)) >= 0) {
        *tid = b->core.tid; *beg = b->core.pos;
        *end = b->core.pos + (b->core.n_cigar? bam_cigar2rlen(b->core.n_cigar, bam_get_cigar(b)) : 1);
    }
    return ret;
}